

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O1

void __thiscall
TPZFront<double>::SymbolicAddKel(TPZFront<double> *this,TPZVec<long> *destinationindex)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = destinationindex->fNElements;
  if (0 < lVar1) {
    lVar3 = 0;
    do {
      Local(this,destinationindex->fStore[lVar3]);
      this->fFront = (this->fGlobal).super_TPZVec<long>.fNElements;
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  iVar2 = (int)this->fFront;
  if (this->fFront < (long)this->fMaxFront) {
    iVar2 = this->fMaxFront;
  }
  this->fMaxFront = iVar2;
  return;
}

Assistant:

void TPZFront<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		fFront = fGlobal.NElements();
	}
	fMaxFront=(fFront<fMaxFront)?fMaxFront:fFront;
	
}